

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheatSheetTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupCheatSheet::TEST_GROUP_CppUTestGroupCheatSheet
          (TEST_GROUP_CppUTestGroupCheatSheet *this)

{
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest = (_func_int **)&PTR__Utest_00342a10;
  return;
}

Assistant:

TEST_GROUP(CheatSheet)
{
/* declare a setup method for the test group. Optional. */
    void setup() _override
    {
/* Set method real_one to stub. Automatically restore in teardown */
        UT_PTR_SET(real_one, stub);
    }

/* Declare a teardown method for the test group. Optional */
    void teardown() _override
    {
    }
}